

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Read<double>(KDataStream *this,double *T)

{
  reference pvVar1;
  byte local_21;
  undefined8 uStack_20;
  KUINT8 i;
  NetToDataType<double> OctArray;
  double *T_local;
  KDataStream *this_local;
  
  OctArray = (NetToDataType<double>)T;
  T_local = (double *)this;
  NetToDataType<double>::NetToDataType((NetToDataType<double> *)&stack0xffffffffffffffe0,*T,false);
  local_21 = 0;
  while (local_21 < 8) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_vBuffer,(ulong)this->m_ui16CurrentWritePos);
    *(value_type *)((long)&stack0xffffffffffffffe0 + (ulong)local_21) = *pvVar1;
    local_21 = local_21 + 1;
    this->m_ui16CurrentWritePos = this->m_ui16CurrentWritePos + 1;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<double>::SwapBytes((NetToDataType<double> *)&stack0xffffffffffffffe0);
  }
  *(undefined8 *)OctArray = uStack_20;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}